

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  cmTarget *this_00;
  pointer ppVar4;
  cmGeneratorTarget *this_01;
  pointer pcVar5;
  cmLocalGenerator *pcVar6;
  long *plVar7;
  pointer pbVar8;
  string_view suffix;
  anon_struct_696_16_37873454_for_AutogenTarget *paVar9;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var10;
  _Alloc_hider _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  TargetType TVar14;
  long lVar15;
  string *psVar16;
  string *psVar17;
  _Rb_tree_node_base *p_Var18;
  cmLinkImplementationLibraries *pcVar19;
  mapped_type *pmVar20;
  element_type *peVar21;
  cmGeneratorTarget *pcVar22;
  mapped_type *pmVar23;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *psVar24;
  string *name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  pointer filename;
  pointer __x;
  char *pcVar25;
  pointer pcVar26;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar27;
  pointer pbVar28;
  undefined4 uVar29;
  undefined8 unaff_R13;
  undefined7 uVar31;
  pointer pcVar30;
  GenVarsT *genVars;
  __node_base *p_Var32;
  size_t *psVar33;
  char *pcVar34;
  pointer pcVar35;
  pointer ppVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  string_view prefix;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar38;
  __single_object cc_2;
  __single_object cc;
  string tools;
  string timestampFileGenex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  cmCustomCommandLines commandLines;
  cmGeneratorTarget *libTarget;
  string depFile;
  string autogenComment;
  ConfigString timestampFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  string timestampFileWithoutConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempTimestampFileName;
  string depFileWithoutConfig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempDepFile;
  string timestampFileName;
  string depFileWithConfig;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_578;
  string local_570;
  cmQtAutoGenInitializer *local_550;
  string *local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  pointer local_520;
  pointer local_518;
  pointer local_510;
  pointer local_508;
  pointer local_500;
  GenVarsT *local_4f8;
  undefined1 local_4f0 [8];
  undefined1 local_4e8 [8];
  undefined1 local_4e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  undefined1 local_4c0 [24];
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined8 local_488;
  char local_47c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  char local_428;
  undefined7 uStack_427;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [32];
  pointer local_3d8;
  pointer pbStack_3d0;
  undefined1 auStack_3c8 [32];
  element_type *local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3a0;
  pointer local_398;
  _Alloc_hider local_390;
  pointer local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  undefined1 local_2f0 [12];
  undefined8 local_2e4;
  __node_base local_2d8;
  undefined1 local_2d0 [16];
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_2c0;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_2b8;
  undefined1 local_2b0 [16];
  undefined8 uStack_2a0;
  undefined8 local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_248 [32];
  GenVarsT *local_228;
  string local_220;
  cmListFileBacktrace local_200;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  undefined1 *local_130;
  char *pcStack_128;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  psVar17 = &(this->AutogenTarget).InfoFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,psVar17);
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_418);
  uVar2 = (this->QtVersion).Major;
  if (uVar2 < 6) {
    unaff_R13 = 0;
    uVar29 = 0;
    if ((uVar2 == 5) && (0xe < (this->QtVersion).Minor)) goto LAB_0055c7e4;
  }
  else {
LAB_0055c7e4:
    lVar15 = std::__cxx11::string::find(local_418,0x7e0fd5,0);
    uVar31 = (undefined7)((ulong)unaff_R13 >> 8);
    uVar29 = (undefined4)CONCAT71(uVar31,1);
    if (lVar15 == -1) {
      lVar15 = std::__cxx11::string::find(local_418,0x81e6ec,0);
      uVar29 = (undefined4)CONCAT71(uVar31,lVar15 != -1);
    }
  }
  if ((undefined1 *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
  }
  local_298._0_1_ = false;
  local_298._1_3_ = 0;
  local_298._4_4_ = OLD;
  local_2b0._8_8_ = 0;
  uStack_2a0._0_1_ = false;
  uStack_2a0._1_1_ = false;
  uStack_2a0._2_1_ = false;
  uStack_2a0._3_1_ = false;
  uStack_2a0._4_1_ = false;
  uStack_2a0._5_1_ = false;
  uStack_2a0._6_1_ = false;
  uStack_2a0._7_1_ = false;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8 = &(this->Moc).super_GenVarsT;
  local_550 = this;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,local_4f8,true);
    if ((char)uVar29 == '\0') {
      pvVar27 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b0 + 8);
    }
    else {
      pvVar27 = &local_268;
      if (this->CrossConfig == true) {
        (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_418);
        lVar15 = std::__cxx11::string::find(local_418,0x7e0fd5,0);
        bVar1 = this->UseBetterGraph;
        if ((undefined1 *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
        }
        this = local_550;
        if (lVar15 != -1 && (bVar1 & 1U) == 0) {
          p_Var32 = &(local_550->Moc).CompilationFile.Config._M_h._M_before_begin;
          while (p_Var32 = p_Var32->_M_nxt, p_Var32 != (__node_base *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_268,(value_type *)(p_Var32 + 5));
          }
          goto LAB_0055c976;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar27,&(this->Moc).CompilationFileGenex);
  }
LAB_0055c976:
  genVars = &(this->Uic).super_GenVarsT;
  _local_47c = uVar29;
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    filename = (this->Uic).UiHeaders.
               super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->Uic).UiHeaders.
             super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != ppVar3) {
      do {
        AddGeneratedSource(this,&filename->first,genVars,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2b0 + 8),&filename->second);
        filename = filename + 1;
      } while (filename != ppVar3);
    }
  }
  local_438._M_allocated_capacity = (size_type)&local_428;
  local_438._8_8_ = 0;
  local_428 = '\0';
  local_540._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_530._0_8_ = local_530._0_8_ & 0xffffffffffffff00;
  local_540._0_8_ = (cmCustomCommand *)local_530;
  if (((GenVarsT *)&local_4f8->Enabled)->Enabled == true) {
    std::__cxx11::string::append(local_540);
  }
  if ((((UicT *)genVars)->super_GenVarsT).Enabled == true) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::append(local_540);
    }
    std::__cxx11::string::append(local_540);
  }
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_418._0_8_ = 10;
  local_418._8_8_ = "Automatic ";
  local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_408._8_8_ = local_540._8_8_;
  local_3f8._0_8_ = local_540._0_8_;
  local_3f8._8_8_ = (pointer)0x0;
  local_3f8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  local_3f8._24_8_ = " for target ";
  local_3d8 = (pointer)0x0;
  auStack_3c8._0_8_ = (psVar16->_M_dataplus)._M_p;
  pbStack_3d0 = (pointer)psVar16->_M_string_length;
  auStack_3c8._8_8_ = (pointer)0x0;
  views._M_len = 4;
  views._M_array = (iterator)local_418;
  cmCatViews((string *)local_4f0,views);
  std::__cxx11::string::operator=((string *)local_438._M_local_buf,(string *)local_4f0);
  if (local_4f0 != (undefined1  [8])local_4e0) {
    operator_delete((void *)local_4f0,(ulong)(local_4e0._0_8_ + 1));
  }
  if ((cmCustomCommand *)local_540._0_8_ != (cmCustomCommand *)local_530) {
    operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
  }
  local_4a8._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_4a8._8_8_ = (pointer)0x0;
  local_498._M_allocated_capacity = 0;
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"cmake_autogen","");
  AddCMakeProcessToCommandLines(this,psVar17,(string *)local_418,(cmCustomCommandLines *)local_4a8);
  if ((undefined1 *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
  }
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_418);
  lVar15 = std::__cxx11::string::find(local_418,0x7dac01,0);
  if ((undefined1 *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
  }
  if (((lVar15 == -1) || ((this->AutogenTarget).GlobalTarget != false)) ||
     ((this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((this->AutogenTarget).DependOrigin == true) {
      local_4e0._8_8_ = local_4e8;
      local_4e8 = (undefined1  [8])((ulong)local_4e8 & 0xffffffff00000000);
      local_4e0._0_8_ = (pointer)0x0;
      local_4d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pbVar28 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_498._8_8_ =
           (this->ConfigsList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_4d0._M_allocated_capacity = local_4e0._8_8_;
      if (pbVar28 != (pointer)local_498._8_8_) {
        local_228 = genVars;
        do {
          local_548 = pbVar28;
          pcVar19 = cmGeneratorTarget::GetLinkImplementationLibraries
                              (local_550->GenTarget,pbVar28,Link);
          if (pcVar19 != (cmLinkImplementationLibraries *)0x0) {
            pcVar30 = (pcVar19->Libraries).
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_488 = (pcVar19->Libraries).
                        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            if (pcVar30 != (pointer)local_488) {
              do {
                paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pcVar30->super_cmLinkItem).Target;
                local_478._M_allocated_capacity = (size_type)paVar37;
                if (paVar37 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  pcVar22 = local_550->GenTarget;
                  local_570._M_dataplus._M_p = (pointer)paVar37;
                  TVar14 = cmGeneratorTarget::GetType(pcVar22);
                  if ((TVar14 == STATIC_LIBRARY) &&
                     (TVar14 = cmGeneratorTarget::GetType((cmGeneratorTarget *)paVar37),
                     TVar14 == STATIC_LIBRARY)) {
                    local_540._8_8_ = local_540._8_8_ & 0xffffffff00000000;
                    local_530._0_8_ = (pointer)0x0;
                    local_530._8_8_ = local_540 + 8;
                    local_518 = (pointer)0x0;
                    local_3d8 = (pointer)0x0;
                    pbStack_3d0 = (pointer)0x0;
                    local_3f8._16_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_3f8._24_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_3f8._0_8_ = (cmCustomCommand *)0x0;
                    local_3f8._8_8_ = (pointer)0x0;
                    local_408._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_408._8_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_418._0_8_ = (undefined1 *)0x0;
                    local_418._8_8_ = (pointer)0x0;
                    local_520 = (pointer)local_530._8_8_;
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                         *)local_418,0);
                    std::
                    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    ::_M_insert_unique<cmGeneratorTarget_const*const&>
                              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                *)local_540,(cmGeneratorTarget **)&local_570);
                    if ((undefined1 *)local_3f8._16_8_ ==
                        (undefined1 *)((long)&local_3d8[-1].field_2 + 8)) {
                      std::deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                  *)local_418,(cmGeneratorTarget **)&local_570);
                    }
                    else {
                      ((_Alloc_hider *)local_3f8._16_8_)->_M_p = local_570._M_dataplus._M_p;
                      local_3f8._16_8_ = local_3f8._16_8_ + 8;
                    }
                    if (local_3f8._16_8_ != local_408._0_8_) {
                      do {
                        this_01 = *(cmGeneratorTarget **)local_408._0_8_;
                        if ((PolicyStatus *)local_408._0_8_ ==
                            &((cmCustomCommand *)(local_3f8._0_8_ + -0x140))->CMP0147Status) {
                          operator_delete((void *)local_408._8_8_,0x200);
                          local_408._0_8_ = *(size_type *)(local_3f8._8_8_ + 8);
                          local_3f8._0_8_ = local_408._0_8_ + 0x200;
                          local_408._8_8_ = local_408._0_8_;
                          local_3f8._8_8_ = (size_type *)(local_3f8._8_8_ + 8);
                        }
                        else {
                          local_408._0_8_ = local_408._0_8_ + 8;
                        }
                        if (this_01 == pcVar22) {
                          std::
                          _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                          *)local_418);
                          std::
                          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                          ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                       *)local_540);
                          goto LAB_0055d4d8;
                        }
                        pcVar19 = cmGeneratorTarget::GetLinkImplementationLibraries
                                            (this_01,local_548,Link);
                        if (pcVar19 != (cmLinkImplementationLibraries *)0x0) {
                          pcVar5 = (pcVar19->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          for (pcVar26 = (pcVar19->Libraries).
                                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                              pcVar26 != pcVar5; pcVar26 = pcVar26 + 1) {
                            local_458._M_allocated_capacity =
                                 (size_type)(pcVar26->super_cmLinkItem).Target;
                            if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_458._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) &&
                                (TVar14 = cmGeneratorTarget::GetType
                                                    ((cmGeneratorTarget *)
                                                     local_458._M_allocated_capacity),
                                TVar14 == STATIC_LIBRARY)) &&
                               (pVar38 = std::
                                         _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                         ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                   ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)local_540,
                                                  (cmGeneratorTarget **)
                                                  &local_458._M_allocated_capacity),
                               ((undefined1  [16])pVar38 & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0)) {
                              if ((undefined1 *)local_3f8._16_8_ ==
                                  (undefined1 *)((long)&local_3d8[-1].field_2 + 8)) {
                                std::
                                deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                          ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                            *)local_418,
                                           (cmGeneratorTarget **)&local_458._M_allocated_capacity);
                              }
                              else {
                                ((_Alloc_hider *)local_3f8._16_8_)->_M_p =
                                     (pointer)local_458._M_allocated_capacity;
                                local_3f8._16_8_ = local_3f8._16_8_ + 8;
                              }
                            }
                          }
                        }
                      } while (local_3f8._16_8_ != local_408._0_8_);
                    }
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                    *)local_418);
                    std::
                    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                 *)local_540);
                  }
                  pmVar20 = std::
                            map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                            ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                          *)local_4f0,(key_type *)&local_478._M_allocated_capacity);
                  *pmVar20 = *pmVar20 + 1;
                }
LAB_0055d4d8:
                pcVar30 = pcVar30 + 1;
              } while (pcVar30 != (pointer)local_488);
            }
          }
          genVars = local_228;
          this = local_550;
          pbVar28 = local_548 + 1;
        } while (pbVar28 != (pointer)local_498._8_8_);
        if ((element_type *)local_4e0._8_8_ != (element_type *)local_4e8) {
          paVar9 = &local_550->AutogenTarget;
          peVar21 = (element_type *)local_4e0._8_8_;
          do {
            if ((peVar21->Value).FilePath._M_string_length ==
                (long)(this->ConfigsList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->ConfigsList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) {
              std::
              _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
              ::_M_insert_unique<cmTarget*const&>
                        ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                          *)&paVar9->DependTargets,
                         (cmTarget **)(peVar21->Value).FilePath._M_dataplus._M_p);
            }
            peVar21 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar21);
          } while (peVar21 != (element_type *)local_4e8);
        }
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)local_4f0);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4c0,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)local_418);
    if (local_47c == '\0') {
      local_548 = (string *)0x0;
    }
    else {
      psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_418._8_8_ = (psVar17->_M_dataplus)._M_p;
      local_418._0_8_ = psVar17->_M_string_length;
      local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_408[8] = true;
      local_408._9_3_ = 0;
      local_408._12_4_ = OLD;
      local_3f8._0_8_ = "_autogen_timestamp_deps";
      local_3f8._8_8_ = (pointer)0x0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_418;
      cmCatViews((string *)local_4f0,views_01);
      std::make_unique<cmCustomCommand>();
      pcVar35 = (this->Dir).Work._M_dataplus._M_p;
      if (pcVar35 == (pointer)0x0) {
        pcVar35 = "";
      }
      pcVar34 = (char *)((local_578._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar17 = &(local_578._M_head_impl)->WorkingDirectory;
      strlen(pcVar35);
      std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar34,(ulong)pcVar35);
      _Var10._M_head_impl = local_578._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_90,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4c0);
      cmCustomCommand::SetDepends(_Var10._M_head_impl,&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      cmCustomCommand::SetEscapeOldStyle(local_578._M_head_impl,false);
      local_2b8._M_head_impl = (cmGeneratorTarget *)local_578._M_head_impl;
      local_578._M_head_impl = (cmCustomCommand *)0x0;
      local_548 = (string *)
                  cmLocalGenerator::AddUtilityCommand
                            (this->LocalGen,(string *)local_4f0,true,
                             (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                             &local_2b8);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_2b8);
      pcVar6 = this->LocalGen;
      pcVar22 = (cmGeneratorTarget *)operator_new(0xaa8);
      cmGeneratorTarget::cmGeneratorTarget(pcVar22,(cmTarget *)local_548,pcVar6);
      local_2c0._M_head_impl = pcVar22;
      cmLocalGenerator::AddGeneratorTarget
                (pcVar6,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        &local_2c0);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 &local_2c0);
      if ((this->TargetsFolder)._M_string_length != 0) {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"FOLDER","");
        cmTarget::SetProperty
                  ((cmTarget *)local_548,(string *)local_418,(cmValue)&this->TargetsFolder);
        if ((undefined1 *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
        }
      }
      uVar12 = local_4c0._0_8_;
      if (local_4c0._8_8_ != local_4c0._0_8_) {
        paVar37 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4c0._0_8_)->field_2;
        do {
          plVar7 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar37 + -1))->_M_dataplus)._M_p;
          if (paVar37 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar7) {
            operator_delete(plVar7,paVar37->_M_allocated_capacity + 1);
          }
          ppVar36 = (pointer)(paVar37 + 1);
          paVar37 = paVar37 + 2;
        } while (ppVar36 != (pointer)local_4c0._8_8_);
        local_4c0._8_8_ = uVar12;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4c0,(value_type *)local_4f0);
      AddAutogenExecutableToDependencies
                (this,local_4f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4c0);
      AddAutogenExecutableToDependencies
                (this,genVars,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4c0);
      local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
      local_570._M_string_length = 0;
      local_570.field_2._M_local_buf[0] = '\0';
      local_458._M_allocated_capacity = (size_type)&local_448;
      local_458._8_8_ = 0;
      local_448._M_local_buf[0] = '\0';
      if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
        local_478._M_allocated_capacity = (size_type)&local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"$<CONFIG>","");
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"timestamp_","");
        local_418._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_418._0_8_ = (this->Dir).Build._M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408[8] = true;
        local_408._9_3_ = 0;
        local_408._12_4_ = OLD;
        local_3f8._0_8_ = "/deps_";
        local_3f8._8_8_ = (pointer)0x0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_418;
        cmCatViews(&local_220,views_02);
        std::operator+(&local_190,&local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_478);
        local_418._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_418._0_8_ = (this->Dir).Build._M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408[8] = true;
        local_408._9_3_ = 0;
        local_408._12_4_ = OLD;
        local_3f8._0_8_ = "/";
        local_3f8._8_8_ = (pointer)0x0;
        local_3f8._16_8_ = local_190._M_string_length;
        local_3f8._24_8_ = local_190._M_dataplus._M_p;
        local_3d8 = (pointer)0x0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)local_418;
        cmCatViews((string *)local_540,views_03);
        std::__cxx11::string::operator=((string *)&local_570,(string *)local_540);
        if ((cmCustomCommand *)local_540._0_8_ != (cmCustomCommand *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        local_418._0_8_ = local_220._M_string_length;
        local_418._8_8_ = local_220._M_dataplus._M_p;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408._8_8_ = local_478._8_8_;
        local_3f8._0_8_ = local_478._M_allocated_capacity;
        local_3f8._8_8_ = (pointer)0x0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_418;
        cmCatViews(&local_150,views_04);
        std::__cxx11::string::_M_assign((string *)local_458._M_local_buf);
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_418._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_418._0_8_ = psVar17->_M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
        local_408._8_8_ = "-E";
        local_3f8._0_8_ = &DAT_00000005;
        local_3f8._8_8_ = "touch";
        local_3f8._16_8_ = local_570._M_string_length;
        local_3f8._24_8_ = local_570._M_dataplus._M_p;
        ilist_00._M_len = 4;
        ilist_00._M_array = (iterator)local_418;
        cmMakeCommandLine((cmCustomCommandLine *)local_540,ilist_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8,
                   (cmCustomCommandLine *)local_540);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_540);
        local_418._0_8_ = local_408;
        local_418._8_8_ = (pointer)0x0;
        local_408._0_8_ = local_408._0_8_ & 0xffffffffffffff00;
        local_3f8._0_8_ = auStack_3c8;
        local_3f8._8_8_ = (pointer)0x1;
        local_3f8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._24_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_3d8 = (pointer)CONCAT44(local_3d8._4_4_,0x3f800000);
        pbStack_3d0 = (pointer)0x0;
        auStack_3c8._0_8_ = (pointer)0x0;
        pbVar28 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar28 != pbVar8) {
          local_488 = &(local_550->AutogenTarget).DepFileRuleName.Config;
          local_498._8_8_ = &(local_550->AutogenTarget).DepFile.Config;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_248,&local_288,pbVar28);
            std::operator+(&local_1b0,&local_220,pbVar28);
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_3f8,pbVar28);
            std::__cxx11::string::_M_assign((string *)pmVar23);
            local_540._8_8_ = (local_550->Dir).RelativeBuild._M_dataplus._M_p;
            local_540._0_8_ = (local_550->Dir).RelativeBuild._M_string_length;
            local_530._0_8_ = (pointer)0x0;
            local_530._8_8_ = (pointer)0x1;
            local_520 = (pointer)0x8866a1;
            local_518 = (pointer)0x0;
            local_510 = (pointer)local_248._8_8_;
            local_508 = (pointer)local_248._0_8_;
            local_500 = (pointer)0x0;
            views_05._M_len = 3;
            views_05._M_array = (iterator)local_540;
            cmCatViews(&local_1d0,views_05);
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_488,pbVar28);
            std::__cxx11::string::operator=((string *)pmVar23,(string *)&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_498._8_8_,pbVar28);
            std::__cxx11::string::_M_assign((string *)pmVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
              operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
            }
            pbVar28 = pbVar28 + 1;
          } while (pbVar28 != pbVar8);
        }
        this = local_550;
        AddGeneratedSource(local_550,(ConfigString *)local_418,local_4f8,false);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_3f8);
        if ((cmCustomCommand *)local_418._0_8_ != (cmCustomCommand *)local_408) {
          operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_allocated_capacity != &local_468) {
          operator_delete((void *)local_478._M_allocated_capacity,
                          (ulong)(local_468._M_allocated_capacity + 1));
        }
      }
      else {
        local_418._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_418._0_8_ = (this->Dir).Build._M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408[8] = true;
        local_408._9_3_ = 0;
        local_408._12_4_ = OLD;
        local_3f8._0_8_ = "/";
        local_3f8._8_8_ = (pointer)0x0;
        local_3f8._16_8_ = &DAT_00000009;
        local_3f8._24_8_ = "timestamp";
        local_3d8 = (pointer)0x0;
        views_06._M_len = 3;
        views_06._M_array = (iterator)local_418;
        cmCatViews((string *)local_540,views_06);
        std::__cxx11::string::operator=((string *)&local_570,(string *)local_540);
        if ((cmCustomCommand *)local_540._0_8_ != (cmCustomCommand *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        local_418._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_418._0_8_ = (this->Dir).Build._M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408[8] = true;
        local_408._9_3_ = 0;
        local_408._12_4_ = OLD;
        local_3f8._0_8_ = "/deps";
        local_3f8._8_8_ = (pointer)0x0;
        views_07._M_len = 2;
        views_07._M_array = (iterator)local_418;
        cmCatViews((string *)local_540,views_07);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFile,(string *)local_540);
        if ((cmCustomCommand *)local_540._0_8_ != (cmCustomCommand *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        std::__cxx11::string::_M_assign((string *)local_458._M_local_buf);
        local_418._8_8_ = (this->Dir).RelativeBuild._M_dataplus._M_p;
        local_418._0_8_ = (this->Dir).RelativeBuild._M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408[8] = true;
        local_408._9_3_ = 0;
        local_408._12_4_ = OLD;
        local_3f8._0_8_ = "/";
        local_3f8._8_8_ = (pointer)0x0;
        local_3f8._16_8_ = &DAT_00000009;
        local_3f8._24_8_ = "timestamp";
        local_3d8 = (pointer)0x0;
        views_08._M_len = 3;
        views_08._M_array = (iterator)local_418;
        cmCatViews((string *)local_540,views_08);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)local_540);
        if ((cmCustomCommand *)local_540._0_8_ != (cmCustomCommand *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_418._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_418._0_8_ = psVar17->_M_string_length;
        local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
        local_408._8_8_ = "-E";
        local_3f8._0_8_ = &DAT_00000005;
        local_3f8._8_8_ = "touch";
        local_3f8._16_8_ = local_570._M_string_length;
        local_3f8._24_8_ = local_570._M_dataplus._M_p;
        ilist_01._M_len = 4;
        ilist_01._M_array = (iterator)local_418;
        cmMakeCommandLine((cmCustomCommandLine *)local_540,ilist_01);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8,
                   (cmCustomCommandLine *)local_540);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_540);
        AddGeneratedSource(this,&local_570,local_4f8,false);
      }
      std::make_unique<cmCustomCommand>();
      uVar12 = local_418._0_8_;
      _Var10._M_head_impl = local_578._M_head_impl;
      local_418._0_8_ = (undefined1 *)0x0;
      local_578._M_head_impl = (cmCustomCommand *)uVar12;
      if (_Var10._M_head_impl != (cmCustomCommand *)0x0) {
        cmCustomCommand::~cmCustomCommand(_Var10._M_head_impl);
        operator_delete(_Var10._M_head_impl,0x140);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_418);
      _Var10._M_head_impl = local_578._M_head_impl;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_570._M_dataplus._M_p,
                 (long)&((_Alloc_hider *)local_570._M_string_length)->_M_p +
                 local_570._M_dataplus._M_p);
      cmCustomCommand::SetOutputs(_Var10._M_head_impl,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      _Var10._M_head_impl = local_578._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a8,&local_268);
      cmCustomCommand::SetByproducts(_Var10._M_head_impl,&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      _Var10._M_head_impl = local_578._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4c0);
      cmCustomCommand::SetDepends(_Var10._M_head_impl,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      _Var10._M_head_impl = local_578._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_d8,
                 (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8);
      cmCustomCommand::SetCommandLines(_Var10._M_head_impl,(cmCustomCommandLines *)&local_d8);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_d8);
      cmCustomCommand::SetComment(local_578._M_head_impl,(char *)local_438._M_allocated_capacity);
      pcVar35 = (this->Dir).Work._M_dataplus._M_p;
      pcVar34 = "";
      if (pcVar35 != (pointer)0x0) {
        pcVar34 = pcVar35;
      }
      pcVar25 = (char *)((local_578._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar17 = &(local_578._M_head_impl)->WorkingDirectory;
      strlen(pcVar34);
      std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar25,(ulong)pcVar34);
      cmCustomCommand::SetEscapeOldStyle(local_578._M_head_impl,false);
      cmCustomCommand::SetDepfile(local_578._M_head_impl,(string *)&local_458);
      (local_578._M_head_impl)->StdPipesUTF8 = true;
      local_2d0._8_8_ = local_578._M_head_impl;
      local_578._M_head_impl = (cmCustomCommand *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                 (local_2d0 + 8),false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                 (local_2d0 + 8));
      uVar12 = local_4c0._8_8_;
      if (local_4c0._8_8_ != local_4c0._0_8_) {
        paVar37 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4c0._0_8_)->field_2;
        do {
          plVar7 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar37 + -1))->_M_dataplus)._M_p;
          if (paVar37 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar7) {
            operator_delete(plVar7,paVar37->_M_allocated_capacity + 1);
          }
          ppVar36 = (pointer)(paVar37 + 1);
          paVar37 = paVar37 + 2;
        } while (ppVar36 != (pointer)uVar12);
        local_4c0._8_8_ = local_4c0._0_8_;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4c0,
                 &local_570);
      uVar13 = local_4a8._8_8_;
      uVar12 = local_4a8._0_8_;
      pvVar27 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4a8._0_8_;
      if (local_4a8._8_8_ != local_4a8._0_8_) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar27);
          pvVar27 = pvVar27 + 1;
        } while (pvVar27 !=
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)uVar13);
        local_4a8._8_8_ = uVar12;
      }
      local_438._8_8_ = 0;
      *(char *)local_438._M_allocated_capacity = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_allocated_capacity != &local_448) {
        operator_delete((void *)local_458._M_allocated_capacity,
                        CONCAT71(local_448._M_allocated_capacity._1_7_,local_448._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,
                        CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                                 local_570.field_2._M_local_buf[0]) + 1);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_578);
      if (local_4f0 != (undefined1  [8])local_4e0) {
        operator_delete((void *)local_4f0,(ulong)(local_4e0._0_8_ + 1));
      }
    }
    std::make_unique<cmCustomCommand>();
    pcVar35 = (this->Dir).Work._M_dataplus._M_p;
    pcVar34 = "";
    if (pcVar35 != (pointer)0x0) {
      pcVar34 = pcVar35;
    }
    pcVar25 = *(char **)(local_540._0_8_ + 0xd0);
    psVar17 = (string *)(local_540._0_8_ + 200);
    strlen(pcVar34);
    std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar25,(ulong)pcVar34);
    uVar12 = local_540._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_2b0 + 8));
    cmCustomCommand::SetByproducts((cmCustomCommand *)uVar12,&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
    uVar12 = local_540._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4c0);
    cmCustomCommand::SetDepends((cmCustomCommand *)uVar12,&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    uVar12 = local_540._0_8_;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_120,
               (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)uVar12,(cmCustomCommandLines *)&local_120);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_120);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_540._0_8_,false);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)local_540._0_8_,(char *)local_438._M_allocated_capacity);
    paVar9 = &this->AutogenTarget;
    local_2d0._0_8_ = local_540._0_8_;
    local_540._0_8_ = (cmCustomCommand *)0x0;
    psVar16 = (string *)
              cmLocalGenerator::AddUtilityCommand
                        (this->LocalGen,&paVar9->Name,true,
                         (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                         local_2d0);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_2d0);
    pcVar6 = this->LocalGen;
    pcVar22 = (cmGeneratorTarget *)operator_new(0xaa8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar22,(cmTarget *)psVar16,pcVar6);
    local_2d8._M_nxt = (_Hash_node_base *)pcVar22;
    cmLocalGenerator::AddGeneratorTarget
              (pcVar6,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &local_2d8);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_2d8)
    ;
    psVar17 = psVar16;
    if (local_548 != (string *)0x0) {
      psVar17 = local_548;
    }
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar24 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      for (p_Var18 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var18 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
        cmTarget::AddUtility((cmTarget *)psVar17,(string *)(p_Var18 + 1),false,this->Makefile);
      }
    }
    for (p_Var18 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var18 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
      name = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var18 + 1));
      cmTarget::AddUtility((cmTarget *)psVar17,name,false,this->Makefile);
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      local_418._0_8_ = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"FOLDER","");
      cmTarget::SetProperty((cmTarget *)psVar16,(string *)local_418,(cmValue)&this->TargetsFolder);
      if ((undefined1 *)local_418._0_8_ != local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
    }
    cmTarget::AddUtility(this->GenTarget->Target,&paVar9->Name,false,this->Makefile);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&paVar9->Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_540);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4c0);
  }
  else {
    for (p_Var18 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var18 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
      this_00 = this->GenTarget->Target;
      psVar17 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var18 + 1));
      cmTarget::AddUtility(this_00,psVar17,false,this->Makefile);
    }
    if (((this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_3f8._0_8_ = auStack_3c8;
      local_418._0_8_ = local_408;
      local_418._8_8_ = 0;
      local_408._0_8_ = local_408._0_8_ & 0xffffffffffffff00;
      local_3f8._8_8_ = (pointer)0x1;
      local_3f8._16_8_ = (_Hash_node_base *)0x0;
      local_3f8._24_8_ = (pointer)0x0;
      local_3d8._4_4_ = (undefined4)((ulong)local_3d8 >> 0x20);
      local_3d8 = (pointer)CONCAT44(local_3d8._4_4_,1.0);
      pbStack_3d0 = (pointer)0x0;
      auStack_3c8._0_8_ = (pointer)0x0;
      local_4f0 = (undefined1  [8])local_4e0;
      local_4e8 = (undefined1  [8])0x0;
      local_4e0._0_8_ = local_4e0._0_8_ & 0xffffffffffffff00;
      local_540._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_540._0_8_ = (this->Dir).Build._M_string_length;
      local_530._0_8_ = (pointer)0x0;
      local_530._8_8_ = (pointer)0x8;
      local_520 = (pointer)0x8254a9;
      local_518 = (pointer)0x0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_540;
      cmCatViews(&local_570,views_00);
      local_130 = &DAT_00000006;
      pcStack_128 = ".stamp";
      suffix._M_str = ".stamp";
      suffix._M_len = 6;
      prefix._M_str = local_570._M_dataplus._M_p;
      prefix._M_len = local_570._M_string_length;
      ConfigFileNamesAndGenex(this,(ConfigString *)local_418,(string *)local_4f0,prefix,suffix);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,
                        CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                                 local_570.field_2._M_local_buf[0]) + 1);
      }
      AddGeneratedSource(this,(ConfigString *)local_418,genVars,false);
      psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_540._8_8_ = (psVar17->_M_dataplus)._M_p;
      local_540._0_8_ = psVar17->_M_string_length;
      local_530._0_8_ = (pointer)0x2;
      local_530._8_8_ = "-E";
      local_520 = (pointer)&DAT_00000005;
      local_518 = (pointer)0x7c675b;
      local_510 = (pointer)local_4e8;
      local_508 = (pointer)local_4f0;
      ilist._M_len = 4;
      ilist._M_array = (iterator)local_540;
      cmMakeCommandLine((cmCustomCommandLine *)&local_570,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8,
                 (cmCustomCommandLine *)&local_570);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_570);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_540,&(this->Uic).UiFilesNoOptions);
      __x = (this->Uic).UiFilesWithOptions.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__x != ppVar4) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_540,&__x->first);
          __x = __x + 1;
        } while (__x != ppVar4);
      }
      AddAutogenExecutableToDependencies
                (this,genVars,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_540);
      std::make_unique<cmCustomCommand>();
      _Var11._M_p = local_570._M_dataplus._M_p;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_4f0,(pointer)((long)local_4e8 + (long)local_4f0));
      cmCustomCommand::SetOutputs((cmCustomCommand *)_Var11._M_p,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      _Var11._M_p = local_570._M_dataplus._M_p;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_540);
      cmCustomCommand::SetDepends((cmCustomCommand *)_Var11._M_p,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      cmCustomCommand::SetComment((cmCustomCommand *)local_570._M_dataplus._M_p,"");
      pcVar34 = (this->Dir).Work._M_dataplus._M_p;
      pcVar25 = "";
      if (pcVar34 != (char *)0x0) {
        pcVar25 = pcVar34;
      }
      pcVar34 = *(char **)&(((ConfigAndLanguageToBTStrings *)(local_570._M_dataplus._M_p + 0xd0))->
                           _M_t)._M_impl;
      psVar33 = (size_t *)(local_570._M_dataplus._M_p + 200);
      strlen(pcVar25);
      std::__cxx11::string::_M_replace((ulong)psVar33,0,pcVar34,(ulong)pcVar25);
      cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_570._M_dataplus._M_p,false);
      local_570._M_dataplus._M_p[0x12e] = '\x01';
      local_2b0._0_8_ = local_570._M_dataplus._M_p;
      local_570._M_dataplus._M_p = (pointer)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_2b0,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_2b0);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_570);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_540);
      if (local_4f0 != (undefined1  [8])local_4e0) {
        operator_delete((void *)local_4f0,(ulong)(local_4e0._0_8_ + 1));
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_3f8);
      if ((undefined1 *)local_418._0_8_ != local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
    }
    auStack_3c8._0_8_ = (pointer)0x0;
    auStack_3c8._8_8_ = (pointer)0x0;
    local_3d8 = (pointer)0x0;
    pbStack_3d0 = (pointer)0x0;
    local_3f8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3f8._24_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_3f8._0_8_ = (cmCustomCommand *)0x0;
    local_3f8._8_8_ = (pointer)0x0;
    local_408._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_408._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_418._0_8_ = (undefined1 *)0x0;
    local_418._8_8_ = (pointer)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(auStack_3c8 + 0x10));
    local_390._M_p = (pointer)&local_380;
    local_3a8 = (element_type *)0x0;
    _Stack_3a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_398 = (pointer)0x0;
    local_388 = (pointer)0x0;
    local_380._M_local_buf[0] = '\0';
    local_370._M_allocated_capacity = (size_type)&local_360;
    local_370._8_8_ = 0;
    local_360._M_local_buf[0] = '\0';
    local_350._M_allocated_capacity = (size_type)&local_340;
    local_350._8_8_ = (char *)0x0;
    local_340._M_local_buf[0] = '\0';
    local_330._M_allocated_capacity = (size_type)&local_320;
    local_330._8_8_ = 0;
    local_320._M_local_buf[0] = '\0';
    local_310._M_allocated_capacity = (size_type)&local_300;
    local_310._8_8_ = 0;
    local_300._M_local_buf[0] = '\0';
    local_2f0[0] = false;
    local_2f0[1] = false;
    local_2f0[2] = false;
    local_2f0[3] = true;
    local_2f0[8] = false;
    local_2f0[4] = false;
    local_2f0[5] = false;
    local_2f0[6] = false;
    local_2f0[7] = false;
    local_2e4 = 0x200000002;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_2b0 + 8));
    cmCustomCommand::SetByproducts((cmCustomCommand *)local_418,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_78,
               (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)local_418,(cmCustomCommandLines *)&local_78)
    ;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)local_418,(char *)local_438._M_allocated_capacity);
    cmMakefile::GetBacktrace(this->Makefile);
    cmCustomCommand::SetBacktrace((cmCustomCommand *)local_418,&local_200);
    if (local_200.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_200.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar12 = local_350._8_8_;
    pcVar35 = (this->Dir).Work._M_dataplus._M_p;
    pcVar34 = "";
    if (pcVar35 != (pointer)0x0) {
      pcVar34 = pcVar35;
    }
    strlen(pcVar34);
    std::__cxx11::string::_M_replace((ulong)&local_350,0,(char *)uVar12,(ulong)pcVar34);
    local_2f0[6] = true;
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_418,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_418,true);
    cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_418);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_418);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4a8);
  if ((char *)local_438._M_allocated_capacity != &local_428) {
    operator_delete((void *)local_438._M_allocated_capacity,CONCAT71(uStack_427,local_428) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2b0 + 8));
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  bool const useDepfile = [this]() -> bool {
    auto const& gen = this->GlobalGen->GetName();
    return this->QtVersion >= IntegerVersion(5, 15) &&
      (gen.find("Ninja") != std::string::npos ||
       gen.find("Make") != std::string::npos);
  }();

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useDepfile) {
      if (this->CrossConfig &&
          this->GlobalGen->GetName().find("Ninja") != std::string::npos &&
          !this->UseBetterGraph) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories

  bool constexpr stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  AddCMakeProcessToCommandLines(this->AutogenTarget.InfoFile, "cmake_autogen",
                                commandLines);

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    cmTarget* timestampTarget = nullptr;
    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());
    if (useDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetDepends(dependencies);
      cc->SetEscapeOldStyle(false);
      timestampTarget = this->LocalGen->AddUtilityCommand(timestampTargetName,
                                                          true, std::move(cc));

      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);
      std::string outputFile;
      std::string depFile;
      // Create the custom command that outputs the timestamp file.
      if (this->MultiConfig && this->UseBetterGraph) {
        // create timestamp file with $<CONFIG> in the name so that
        // every cmake_autogen target has its own timestamp file
        std::string const configView = "$<CONFIG>";
        std::string const timestampFileWithoutConfig = "timestamp_";
        std::string const depFileWithoutConfig =
          cmStrCat(this->Dir.Build, "/deps_");
        std::string const timestampFileName =
          timestampFileWithoutConfig + configView;
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        auto const depFileWithConfig =
          cmStrCat(depFileWithoutConfig, configView);
        depFile = depFileWithConfig;
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

        ConfigString outputFileWithConfig;
        for (std::string const& config : this->ConfigsList) {
          auto tempTimestampFileName = timestampFileWithoutConfig + config;
          auto tempDepFile = depFileWithoutConfig + config;
          outputFileWithConfig.Config[config] = tempTimestampFileName;
          this->AutogenTarget.DepFileRuleName.Config[config] =
            cmStrCat(this->Dir.RelativeBuild, "/", tempTimestampFileName);
          this->AutogenTarget.DepFile.Config[config] = tempDepFile;
        }
        this->AddGeneratedSource(outputFileWithConfig, this->Moc);
      } else {
        cm::string_view const timestampFileName = "timestamp";
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        this->AutogenTarget.DepFile.Default =
          cmStrCat(this->Dir.Build, "/deps");
        depFile = this->AutogenTarget.DepFile.Default;
        this->AutogenTarget.DepFileRuleName.Default =
          cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));
        this->AddGeneratedSource(outputFile, this->Moc);
      }
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(depFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
      dependencies.clear();
      dependencies.emplace_back(std::move(outputFile));
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Order the autogen target(s) just before the original target.
    cmTarget* orderTarget = timestampTarget ? timestampTarget : autogenTarget;
    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        orderTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }

    // Add additional autogen target dependencies to autogen target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      orderTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}